

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpproxy.cpp
# Opt level: O3

void __thiscall tcpproxy::~tcpproxy(tcpproxy *this)

{
  naiveconfig *pnVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  
  (this->super_proxy)._vptr_proxy = (_func_int **)&PTR__tcpproxy_00109d70;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->sfh)._M_h);
  if (this->events != (epoll_event *)0x0) {
    operator_delete__(this->events);
    this->events = (epoll_event *)0x0;
  }
  pnVar1 = (this->super_proxy).cfg;
  if (pnVar1 != (naiveconfig *)0x0) {
    lVar4 = *(long *)((long)&pnVar1[-1].hostname.field_2 + 8);
    if (lVar4 != 0) {
      paVar3 = &pnVar1[lVar4 + -1].hostname.field_2;
      lVar4 = lVar4 * -0x38;
      do {
        pcVar2 = (((string *)(paVar3 + -1))->_M_dataplus)._M_p;
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2) {
          operator_delete(pcVar2);
        }
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar3 + -0x38);
        lVar4 = lVar4 + 0x38;
      } while (lVar4 != 0);
    }
    operator_delete__((void *)((long)&pnVar1[-1].hostname.field_2 + 8));
    (this->super_proxy).cfg = (naiveconfig *)0x0;
  }
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->sfh)._M_h);
  proxy::~proxy(&this->super_proxy);
  return;
}

Assistant:

tcpproxy::~tcpproxy()
{
    sfh.clear();
    if (events)
    {
        delete[] events;
        events = NULL;
    }
    if (cfg)
    {
        delete[] cfg;
        cfg = NULL;
    }
}